

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectConstant<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int *piVar2;
  unsigned_long *puVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  long lVar9;
  idx_t iVar10;
  sel_t sVar11;
  int iVar12;
  long lVar13;
  
  piVar2 = (int *)left->data;
  puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  piVar4 = (int *)right->data;
  if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
     ((puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
    iVar1 = piVar2[1];
    lVar5 = *(long *)(piVar2 + 2);
    lVar6 = *(long *)(piVar4 + 2);
    iVar12 = piVar4[1];
    if ((piVar4[1] != iVar1 || *piVar4 != *piVar2) || (iVar12 = iVar1, lVar5 != lVar6)) {
      lVar9 = (long)iVar1 + lVar5 / 86400000000;
      lVar13 = (long)iVar12 + lVar6 / 86400000000;
      if (((long)*piVar2 + lVar9 / 0x1e != (long)*piVar4 + lVar13 / 0x1e) ||
         ((lVar9 % 0x1e != lVar13 % 0x1e || (lVar5 % 86400000000 != lVar6 % 86400000000)))) {
        if (count == 0 || true_sel == (SelectionVector *)0x0) {
          return count;
        }
        psVar7 = sel->sel_vector;
        psVar8 = true_sel->sel_vector;
        iVar10 = 0;
        do {
          sVar11 = (sel_t)iVar10;
          if (psVar7 != (sel_t *)0x0) {
            sVar11 = psVar7[iVar10];
          }
          psVar8[iVar10] = sVar11;
          iVar10 = iVar10 + 1;
        } while (count != iVar10);
        return count;
      }
    }
  }
  if (count != 0 && false_sel != (SelectionVector *)0x0) {
    psVar7 = sel->sel_vector;
    psVar8 = false_sel->sel_vector;
    iVar10 = 0;
    do {
      sVar11 = (sel_t)iVar10;
      if (psVar7 != (sel_t *)0x0) {
        sVar11 = psVar7[iVar10];
      }
      psVar8[iVar10] = sVar11;
      iVar10 = iVar10 + 1;
    } while (count != iVar10);
  }
  return 0;
}

Assistant:

static idx_t SelectConstant(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                            SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);

		// both sides are constant, return either 0 or the count
		// in this case we do not fill in the result selection vector at all
		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right) || !OP::Operation(*ldata, *rdata)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		} else {
			if (true_sel) {
				for (idx_t i = 0; i < count; i++) {
					true_sel->set_index(i, sel->get_index(i));
				}
			}
			return count;
		}
	}